

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::Texture3DMipmapTestInstance::~Texture3DMipmapTestInstance
          (Texture3DMipmapTestInstance *this)

{
  ~Texture3DMipmapTestInstance(this);
  operator_delete(this,0x2b0);
  return;
}

Assistant:

Texture3DMipmapTestInstance::~Texture3DMipmapTestInstance (void)
{
}